

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdir.cpp
# Opt level: O2

bool qt_cleanPath(QString *path)

{
  long lVar1;
  char16_t *pcVar2;
  bool bVar3;
  bool bVar4;
  long in_FS_OFFSET;
  Data *pDVar5;
  QArrayDataPointer<char16_t> local_38;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  lVar1 = (path->d).size;
  if (lVar1 == 0) {
    bVar3 = true;
  }
  else {
    pDVar5 = (path->d).d;
    pcVar2 = (path->d).ptr;
    if (pDVar5 == (Data *)0x0) {
      local_38.d = (Data *)0x0;
      local_38.size = lVar1;
      local_38.ptr = pcVar2;
      pDVar5 = local_38.d;
    }
    else {
      LOCK();
      (pDVar5->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           (pDVar5->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
      local_38.d = (path->d).d;
      local_38.size = (path->d).size;
      local_38.ptr = (path->d).ptr;
    }
    (path->d).d = pDVar5;
    (path->d).ptr = pcVar2;
    (path->d).size = lVar1;
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_38);
    bVar3 = qt_normalizePathSegments(path,(PathNormalizations)0x0);
    if ((1 < (ulong)(path->d).size) &&
       (bVar4 = QString::endsWith(path,(QChar)0x2f,CaseSensitive), bVar4)) {
      QString::chop(path,1);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_18) {
    __stack_chk_fail();
  }
  return bVar3;
}

Assistant:

static bool qt_cleanPath(QString *path)
{
    if (path->isEmpty())
        return true;

    QString &ret = *path;
    ret = QDir::fromNativeSeparators(ret);
    bool ok = qt_normalizePathSegments(&ret, QDirPrivate::DefaultNormalization);

    // Strip away last slash except for root directories
    if (ret.size() > 1 && ret.endsWith(u'/')) {
#if defined (Q_OS_WIN)
        if (!(ret.length() == 3 && ret.at(1) == u':'))
#endif
            ret.chop(1);
    }

    return ok;
}